

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_api.c
# Opt level: O3

int satoko_add_variable(solver_t *s,char sign)

{
  uint entry;
  vec_wl_t *pvVar1;
  vec_act_t *pvVar2;
  vec_uint_t *pvVar3;
  vec_char_t *pvVar4;
  uint uVar5;
  watch_list *pwVar6;
  sdbl_t *psVar7;
  uint *puVar8;
  uint uVar9;
  char *pcVar10;
  char *__file;
  vec_wl_t *pvVar11;
  ulong uVar12;
  size_t sVar13;
  
  pvVar1 = s->watches;
  entry = s->activity->size;
  uVar5 = pvVar1->cap;
  uVar9 = pvVar1->size;
  pvVar11 = pvVar1;
  if (uVar9 == uVar5) {
    uVar5 = (uVar9 >> 1) * 3;
    if (uVar9 < 4) {
      uVar5 = uVar9 * 2;
    }
    pwVar6 = (watch_list *)realloc(pvVar1->watch_lists,(ulong)uVar5 * 0x18);
    pvVar1->watch_lists = pwVar6;
    uVar9 = pvVar1->cap;
    memset(pwVar6 + uVar9,0,(ulong)(uVar5 - uVar9) * 0x18);
    if (pwVar6 == (watch_list *)0x0) {
      printf("failed to realloc memory from %.1f mb to %.1f mb.\n",
             (double)uVar9 * 9.5367431640625e-07,(double)uVar5 * 9.5367431640625e-07);
      fflush(_stdout);
    }
    pvVar1->cap = uVar5;
    uVar9 = pvVar1->size;
    uVar5 = s->watches->cap;
    pvVar11 = s->watches;
  }
  pvVar1->size = uVar9 + 1;
  uVar9 = pvVar11->size;
  if (uVar9 == uVar5) {
    uVar9 = (uVar5 >> 1) * 3;
    if (uVar5 < 4) {
      uVar9 = uVar5 * 2;
    }
    pwVar6 = (watch_list *)realloc(pvVar11->watch_lists,(ulong)uVar9 * 0x18);
    pvVar11->watch_lists = pwVar6;
    uVar5 = pvVar11->cap;
    memset(pwVar6 + uVar5,0,(ulong)(uVar9 - uVar5) * 0x18);
    if (pwVar6 == (watch_list *)0x0) {
      printf("failed to realloc memory from %.1f mb to %.1f mb.\n",
             (double)uVar5 * 9.5367431640625e-07,(double)uVar9 * 9.5367431640625e-07);
      fflush(_stdout);
    }
    pvVar11->cap = uVar9;
    uVar9 = pvVar11->size;
  }
  pvVar11->size = uVar9 + 1;
  pvVar2 = s->activity;
  uVar9 = pvVar2->size;
  uVar12 = (ulong)uVar9;
  if (uVar9 == pvVar2->cap) {
    if (uVar9 < 0x10) {
      psVar7 = (sdbl_t *)realloc(pvVar2->data,0x80);
      pvVar2->data = psVar7;
      uVar9 = 0x10;
      if (psVar7 == (sdbl_t *)0x0) {
LAB_0055e50d:
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_sdbl.h"
        ;
        pcVar10 = "void vec_sdbl_reserve(vec_sdbl_t *, unsigned int)";
        goto LAB_0055e522;
      }
    }
    else {
      if ((int)uVar9 < 1) goto LAB_0055e195;
      psVar7 = (sdbl_t *)realloc(pvVar2->data,uVar12 << 4);
      pvVar2->data = psVar7;
      if (psVar7 == (sdbl_t *)0x0) goto LAB_0055e50d;
      uVar9 = uVar9 * 2;
    }
    pvVar2->cap = uVar9;
    uVar12 = (ulong)pvVar2->size;
  }
LAB_0055e195:
  pvVar2->data[uVar12] = 0;
  pvVar2->size = (int)uVar12 + 1;
  pvVar3 = s->levels;
  uVar9 = pvVar3->size;
  uVar12 = (ulong)uVar9;
  if (uVar9 == pvVar3->cap) {
    if (uVar9 < 0x10) {
      puVar8 = (uint *)realloc(pvVar3->data,0x40);
      pvVar3->data = puVar8;
      uVar9 = 0x10;
      if (puVar8 != (uint *)0x0) {
LAB_0055e206:
        pvVar3->cap = uVar9;
        uVar12 = (ulong)pvVar3->size;
        goto LAB_0055e20d;
      }
    }
    else {
      if ((int)uVar9 < 1) goto LAB_0055e20d;
      puVar8 = (uint *)realloc(pvVar3->data,uVar12 * 8);
      pvVar3->data = puVar8;
      if (puVar8 != (uint *)0x0) {
        uVar9 = uVar9 * 2;
        goto LAB_0055e206;
      }
    }
    goto LAB_0055e4f6;
  }
LAB_0055e20d:
  pvVar3->data[uVar12] = 0;
  pvVar3->size = pvVar3->size + 1;
  pvVar4 = s->assigns;
  uVar9 = pvVar4->size;
  uVar12 = (ulong)uVar9;
  if (uVar9 == pvVar4->cap) {
    if (uVar9 < 0x10) {
      pcVar10 = (char *)realloc(pvVar4->data,0x10);
      pvVar4->data = pcVar10;
      sVar13 = 0x10;
    }
    else {
      if ((int)uVar9 < 1) goto LAB_0055e27c;
      sVar13 = uVar12 * 2;
      pcVar10 = (char *)realloc(pvVar4->data,sVar13);
      pvVar4->data = pcVar10;
    }
    if (pcVar10 != (char *)0x0) {
      pvVar4->cap = (uint)sVar13;
      uVar12 = (ulong)pvVar4->size;
      goto LAB_0055e27c;
    }
  }
  else {
LAB_0055e27c:
    pvVar4->data[uVar12] = '\x03';
    pvVar4->size = pvVar4->size + 1;
    pvVar4 = s->polarity;
    uVar9 = pvVar4->size;
    uVar12 = (ulong)uVar9;
    if (uVar9 == pvVar4->cap) {
      if (uVar9 < 0x10) {
        pcVar10 = (char *)realloc(pvVar4->data,0x10);
        pvVar4->data = pcVar10;
        sVar13 = 0x10;
      }
      else {
        if ((int)uVar9 < 1) goto LAB_0055e2ea;
        sVar13 = uVar12 * 2;
        pcVar10 = (char *)realloc(pvVar4->data,sVar13);
        pvVar4->data = pcVar10;
      }
      if (pcVar10 == (char *)0x0) goto LAB_0055e4df;
      pvVar4->cap = (uint)sVar13;
      uVar12 = (ulong)pvVar4->size;
    }
LAB_0055e2ea:
    pvVar4->data[uVar12] = sign;
    pvVar4->size = pvVar4->size + 1;
    pvVar3 = s->reasons;
    uVar9 = pvVar3->size;
    uVar12 = (ulong)uVar9;
    if (uVar9 == pvVar3->cap) {
      if (uVar9 < 0x10) {
        puVar8 = (uint *)realloc(pvVar3->data,0x40);
        pvVar3->data = puVar8;
        uVar9 = 0x10;
        if (puVar8 != (uint *)0x0) {
LAB_0055e356:
          pvVar3->cap = uVar9;
          uVar12 = (ulong)pvVar3->size;
          goto LAB_0055e35d;
        }
      }
      else {
        if ((int)uVar9 < 1) goto LAB_0055e35d;
        puVar8 = (uint *)realloc(pvVar3->data,uVar12 * 8);
        pvVar3->data = puVar8;
        if (puVar8 != (uint *)0x0) {
          uVar9 = uVar9 * 2;
          goto LAB_0055e356;
        }
      }
LAB_0055e4f6:
      __file = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_uint.h"
      ;
      pcVar10 = "void vec_uint_reserve(vec_uint_t *, unsigned int)";
      goto LAB_0055e522;
    }
LAB_0055e35d:
    pvVar3->data[uVar12] = 0xffffffff;
    pvVar3->size = pvVar3->size + 1;
    pvVar3 = s->stamps;
    uVar9 = pvVar3->size;
    uVar12 = (ulong)uVar9;
    if (uVar9 == pvVar3->cap) {
      if (uVar9 < 0x10) {
        puVar8 = (uint *)realloc(pvVar3->data,0x40);
        pvVar3->data = puVar8;
        uVar9 = 0x10;
        if (puVar8 == (uint *)0x0) goto LAB_0055e4f6;
      }
      else {
        if ((int)uVar9 < 1) goto LAB_0055e3d4;
        puVar8 = (uint *)realloc(pvVar3->data,uVar12 * 8);
        pvVar3->data = puVar8;
        if (puVar8 == (uint *)0x0) goto LAB_0055e4f6;
        uVar9 = uVar9 * 2;
      }
      pvVar3->cap = uVar9;
      uVar12 = (ulong)pvVar3->size;
    }
LAB_0055e3d4:
    pvVar3->data[uVar12] = 0;
    pvVar3->size = pvVar3->size + 1;
    pvVar4 = s->seen;
    uVar9 = pvVar4->size;
    uVar12 = (ulong)uVar9;
    if (uVar9 == pvVar4->cap) {
      if (uVar9 < 0x10) {
        pcVar10 = (char *)realloc(pvVar4->data,0x10);
        pvVar4->data = pcVar10;
        sVar13 = 0x10;
      }
      else {
        if ((int)uVar9 < 1) goto LAB_0055e446;
        sVar13 = uVar12 * 2;
        pcVar10 = (char *)realloc(pvVar4->data,sVar13);
        pvVar4->data = pcVar10;
      }
      if (pcVar10 == (char *)0x0) goto LAB_0055e4df;
      pvVar4->cap = (uint)sVar13;
      uVar12 = (ulong)pvVar4->size;
    }
LAB_0055e446:
    pvVar4->data[uVar12] = '\0';
    pvVar4->size = pvVar4->size + 1;
    heap_insert(s->var_order,entry);
    pvVar4 = s->marks;
    if (pvVar4 == (vec_char_t *)0x0) {
      return entry;
    }
    uVar9 = pvVar4->size;
    uVar12 = (ulong)uVar9;
    if (uVar9 != pvVar4->cap) {
LAB_0055e4bf:
      pvVar4->data[uVar12] = '\0';
      pvVar4->size = pvVar4->size + 1;
      return entry;
    }
    if (uVar9 < 0x10) {
      pcVar10 = (char *)realloc(pvVar4->data,0x10);
      pvVar4->data = pcVar10;
      sVar13 = 0x10;
    }
    else {
      if ((int)uVar9 < 1) goto LAB_0055e4bf;
      sVar13 = uVar12 * 2;
      pcVar10 = (char *)realloc(pvVar4->data,sVar13);
      pvVar4->data = pcVar10;
    }
    if (pcVar10 != (char *)0x0) {
      pvVar4->cap = (uint)sVar13;
      uVar12 = (ulong)pvVar4->size;
      goto LAB_0055e4bf;
    }
  }
LAB_0055e4df:
  __file = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/utils/vec/vec_char.h"
  ;
  pcVar10 = "void vec_char_reserve(vec_char_t *, unsigned int)";
LAB_0055e522:
  __assert_fail("p->data != NULL",__file,0x6e,pcVar10);
}

Assistant:

int satoko_add_variable(solver_t *s, char sign)
{
    unsigned var = vec_act_size(s->activity);
    vec_wl_push(s->watches);
    vec_wl_push(s->watches);
    vec_act_push_back(s->activity, 0);
    vec_uint_push_back(s->levels, 0);
    vec_char_push_back(s->assigns, SATOKO_VAR_UNASSING);
    vec_char_push_back(s->polarity, sign);
    vec_uint_push_back(s->reasons, UNDEF);
    vec_uint_push_back(s->stamps, 0);
    vec_char_push_back(s->seen, 0);
    heap_insert(s->var_order, var);
    if (s->marks)
        vec_char_push_back(s->marks, 0);
    return var;
}